

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdminPanelView.cpp
# Opt level: O1

void __thiscall AdminPanelView::display(AdminPanelView *this)

{
  int iVar1;
  Application *this_00;
  BaseUser *this_01;
  ostream *poVar2;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Admin: ",7);
  this_00 = Application::getInstance();
  this_01 = Application::getCurrentUser(this_00);
  BaseUser::getFullName_abi_cxx11_(&local_38,this_01);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  View::populateMenu(&this->super_View);
  iVar1 = Input::getInt();
  View::callView(&this->super_View,iVar1 + -1);
  return;
}

Assistant:

void AdminPanelView::display() {
    cout << "Admin: " << Application::getInstance().getCurrentUser()->getFullName() << endl;
    populateMenu();
    callView(Input::getInt() - 1);
}